

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O0

bool __thiscall
wallet::LegacyScriptPubKeyMan::SetupGeneration(LegacyScriptPubKeyMan *this,bool force)

{
  long lVar1;
  bool bVar2;
  uint uVar3;
  byte in_SIL;
  LegacyScriptPubKeyMan *in_RDI;
  long in_FS_OFFSET;
  undefined6 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb6;
  undefined1 in_stack_ffffffffffffffb7;
  LegacyScriptPubKeyMan *in_stack_ffffffffffffffb8;
  LegacyScriptPubKeyMan *in_stack_fffffffffffffff0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = CanGenerateKeys(in_RDI);
  if (((bVar2) && ((in_SIL & 1) == 0)) ||
     (uVar3 = (*((in_RDI->super_LegacyDataSPKM).super_ScriptPubKeyMan.m_storage)->
                _vptr_WalletStorage[10])(), (uVar3 & 1) != 0)) {
    bVar2 = false;
  }
  else {
    GenerateNewSeed(in_stack_ffffffffffffffb8);
    SetHDSeed(in_stack_ffffffffffffffb8,
              (CPubKey *)
              CONCAT17(in_stack_ffffffffffffffb7,
                       CONCAT16(in_stack_ffffffffffffffb6,in_stack_ffffffffffffffb0)));
    bVar2 = NewKeyPool(in_stack_fffffffffffffff0);
    if (bVar2) {
      bVar2 = true;
    }
    else {
      bVar2 = false;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return bVar2;
}

Assistant:

bool LegacyScriptPubKeyMan::SetupGeneration(bool force)
{
    if ((CanGenerateKeys() && !force) || m_storage.IsLocked()) {
        return false;
    }

    SetHDSeed(GenerateNewSeed());
    if (!NewKeyPool()) {
        return false;
    }
    return true;
}